

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffgphd(fitsfile *fptr,int maxdim,int *simple,int *bitpix,int *naxis,LONGLONG *naxes,long *pcount
          ,long *gcount,int *extend,double *bscale,double *bzero,LONGLONG *blank,int *nspace,
          int *status)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint nrec;
  long lVar6;
  char *pcVar7;
  long longnaxis;
  LONGLONG axislen;
  long longbitpix;
  int namelen;
  char value [71];
  char message [81];
  char name [75];
  char comm [73];
  char xtension [71];
  char card [81];
  char keyword [75];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  if (simple != (int *)0x0) {
    *simple = 1;
  }
  ffgkyn(fptr,1,name,value,comm,status);
  if (fptr->Fptr->curhdu == 0) {
    iVar4 = bcmp(name,"SIMPLE",7);
    if (iVar4 != 0) {
      snprintf(message,0x51,"First keyword of the file is not SIMPLE: %s",name);
      ffpmsg(message);
      *status = 0xdd;
      return 0xdd;
    }
    if (value[0] == 'T') {
      bVar3 = true;
    }
    else {
      if (value[0] != 'F') {
        *status = 0xdc;
        return 0xdc;
      }
      bVar3 = true;
      if (simple != (int *)0x0) {
        *simple = 0;
      }
    }
LAB_001aa690:
    ffgkyn(fptr,2,name,value,comm,status);
    iVar4 = bcmp(name,"BITPIX",7);
    if (iVar4 != 0) {
      snprintf(message,0x51,"Second keyword of the extension is not BITPIX: %s",name);
      ffpmsg(message);
      *status = 0xde;
      return 0xde;
    }
    iVar4 = ffc2ii(value,&longbitpix,status);
    if (iVar4 < 1) {
      if ((((longbitpix - 8U < 0x39) && ((0x100000001000101U >> (longbitpix - 8U & 0x3f) & 1) != 0))
          || (longbitpix == -0x40)) || (longbitpix == -0x20)) {
        if (bitpix != (int *)0x0) {
          *bitpix = (int)longbitpix;
        }
        ffgtkn(fptr,3,"NAXIS",&longnaxis,status);
        if (*status == 0xd0) {
          *status = 0xdf;
          return 0xdf;
        }
        if (999 < longnaxis || *status == 0xd1) {
          snprintf(message,0x51,"NAXIS = %ld is illegal");
          ffpmsg(message);
          *status = 0xd4;
          return 0xd4;
        }
        if (naxis != (int *)0x0) {
          *naxis = (int)longnaxis;
        }
        lVar1 = 0;
        while (lVar6 = lVar1, lVar6 < longnaxis) {
          lVar1 = lVar6 + 1;
          ffkeyn("NAXIS",(int)lVar1,keyword,status);
          ffgtknjj(fptr,(int)lVar6 + 4,keyword,&axislen,status);
          if (*status == 0xd1) {
            *status = 0xd5;
            return 0xd5;
          }
          if (*status == 0xd0) {
            *status = 0xe0;
            return 0xe0;
          }
          if (lVar6 < maxdim && naxes != (LONGLONG *)0x0) {
            naxes[lVar6] = axislen;
          }
        }
        nrec = (int)lVar6 + 4;
LAB_001aa985:
        if (bscale != (double *)0x0) {
          *bscale = 1.0;
        }
        if (bzero != (double *)0x0) {
          *bzero = 0.0;
        }
        if (pcount != (long *)0x0) {
          *pcount = 0;
        }
        if (gcount != (long *)0x0) {
          *gcount = 1;
        }
        if (extend != (int *)0x0) {
          *extend = 0;
        }
        if (blank != (LONGLONG *)0x0) {
          *blank = 0x4995cdd1;
        }
        *nspace = 0;
        iVar4 = *status;
        bVar2 = false;
        iVar5 = iVar4;
        do {
          if (bVar2) {
            if (bVar3) {
              return iVar5;
            }
            *status = 0xe9;
            return 0xe9;
          }
          iVar5 = ffgrec(fptr,nrec,card,status);
          if (iVar5 < 1) {
            ffgknm(card,name,&namelen,status);
            iVar5 = fftrec(name,status);
            if (0 < iVar5) {
              snprintf(message,0x51,"Name of keyword no. %d contains illegal character(s): %s",
                       (ulong)nrec,name);
              ffpmsg(message);
              if (nrec % 0x24 == 0) {
                ffpmsg("  (This may indicate a missing END keyword).");
              }
            }
            iVar5 = bcmp(name,"BSCALE",7);
            if ((bscale == (double *)0x0) || (iVar5 != 0)) {
              iVar5 = bcmp(name,"BZERO",6);
              if ((bzero == (double *)0x0) || (iVar5 != 0)) {
                iVar5 = bcmp(name,"BLANK",6);
                if ((blank == (LONGLONG *)0x0) || (iVar5 != 0)) {
                  iVar5 = bcmp(name,"PCOUNT",7);
                  if ((pcount == (long *)0x0) || (iVar5 != 0)) {
                    iVar5 = bcmp(name,"GCOUNT",7);
                    if ((gcount == (long *)0x0) || (iVar5 != 0)) {
                      iVar5 = bcmp(name,"EXTEND",7);
                      if ((extend == (int *)0x0) || (iVar5 != 0)) {
                        bVar2 = true;
                        if (name._0_4_ != 0x444e45) {
                          if (card[0] == '\0') {
                            *nspace = *nspace + 1;
                          }
                          else {
                            *nspace = 0;
                          }
                          goto LAB_001aab83;
                        }
                        goto LAB_001aae86;
                      }
                      *nspace = 0;
                      ffpsvc(card,value,comm,status);
                      iVar5 = ffc2ll(value,extend,status);
                      if (0 < iVar5) {
                        *status = iVar4;
                        *extend = 0;
                        pcVar7 = "Error reading EXTEND keyword value as a logical: %s";
                        goto LAB_001aacbc;
                      }
                      goto LAB_001aae83;
                    }
                    *nspace = 0;
                    ffpsvc(card,value,comm,status);
                    iVar5 = ffc2ii(value,gcount,status);
                    if (0 < iVar5) {
                      pcVar7 = "Error reading GCOUNT keyword value as an integer: %s";
                      goto LAB_001aadd1;
                    }
                  }
                  else {
                    *nspace = 0;
                    ffpsvc(card,value,comm,status);
                    iVar5 = ffc2ii(value,pcount,status);
                    if (0 < iVar5) {
                      pcVar7 = "Error reading PCOUNT keyword value as an integer: %s";
LAB_001aadd1:
                      snprintf(message,0x51,pcVar7,value);
                      ffpmsg(message);
                    }
                  }
                  bVar2 = false;
                  goto LAB_001aae86;
                }
                *nspace = 0;
                ffpsvc(card,value,comm,status);
                iVar5 = ffc2jj(value,blank,status);
                if (0 < iVar5) {
                  *status = iVar4;
                  *blank = 0x4995cdd1;
                  pcVar7 = "Error reading BLANK keyword value as an integer: %s";
                  goto LAB_001aacbc;
                }
              }
              else {
                *nspace = 0;
                ffpsvc(card,value,comm,status);
                iVar5 = ffc2dd(value,bzero,status);
                if (0 < iVar5) {
                  *status = iVar4;
                  *bzero = 0.0;
                  pcVar7 = "Error reading BZERO keyword value as a double: %s";
                  goto LAB_001aacbc;
                }
              }
            }
            else {
              *nspace = 0;
              ffpsvc(card,value,comm,status);
              iVar5 = ffc2dd(value,bscale,status);
              if (0 < iVar5) {
                *status = iVar4;
                *bscale = 1.0;
                pcVar7 = "Error reading BSCALE keyword value as a double: %s";
LAB_001aacbc:
                snprintf(message,0x51,pcVar7,value);
                ffpmsg(message);
              }
            }
LAB_001aae83:
            bVar2 = false;
LAB_001aae86:
            iVar5 = *status;
          }
          else {
            if (*status != 0xcb) {
              ffpmsg("Failed to find the END keyword in header (ffgphd).");
LAB_001aab83:
              bVar2 = false;
              goto LAB_001aae86;
            }
            *status = iVar4;
            bVar2 = true;
            iVar5 = iVar4;
          }
          nrec = nrec + 1;
        } while (iVar5 < 1);
        pcVar7 = "Failed to read the required image extension header keywords.";
        if (fptr->Fptr->curhdu == 0) {
          pcVar7 = "Failed to read the required primary array header keywords.";
        }
        goto LAB_001aa57a;
      }
      pcVar7 = "Illegal value for BITPIX keyword: %s";
    }
    else {
      pcVar7 = "Value of BITPIX keyword is not an integer: %s";
    }
    snprintf(message,0x51,pcVar7,value);
    ffpmsg(message);
    *status = 0xd3;
    iVar4 = 0xd3;
  }
  else {
    iVar4 = bcmp(name,"XTENSION",9);
    if (iVar4 != 0) {
      snprintf(message,0x51,"First keyword of the extension is not XTENSION: %s",name);
      ffpmsg(message);
      *status = 0xe1;
      return 0xe1;
    }
    iVar4 = ffc2s(value,xtension,status);
    if (iVar4 < 1) {
      if (value[0] == '\'') {
        iVar4 = bcmp(xtension,"IMAGE",6);
        bVar3 = true;
        if ((iVar4 == 0) || (iVar4 = bcmp(xtension,"IUEIMAGE",9), iVar4 == 0)) goto LAB_001aa690;
      }
      bVar3 = false;
      snprintf(message,0x51,"This is not an IMAGE extension: %s",value);
      ffpmsg(message);
      if (fptr->Fptr->compressimg == 0) goto LAB_001aa690;
      ffxmsg(3,message);
      if ((bitpix == (int *)0x0) || (ffgidt(fptr,bitpix,status), *status < 1)) {
        if ((naxis == (int *)0x0) || (ffgidm(fptr,naxis,status), *status < 1)) {
          nrec = 9;
          bVar3 = true;
          if ((naxes == (LONGLONG *)0x0) || (ffgiszll(fptr,maxdim,naxes,status), *status < 1))
          goto LAB_001aa985;
          pcVar7 = "Error reading NAXISn values of compressed image";
        }
        else {
          pcVar7 = "Error reading NAXIS value of compressed image";
        }
      }
      else {
        pcVar7 = "Error reading BITPIX value of compressed image";
      }
    }
    else {
      ffpmsg("Bad value string for XTENSION keyword:");
      pcVar7 = value;
    }
LAB_001aa57a:
    ffpmsg(pcVar7);
    iVar4 = *status;
  }
  return iVar4;
}

Assistant:

int ffgphd(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxdim,      /* I - maximum no. of dimensions to read;       */
           int *simple,     /* O - does file conform to FITS standard? 1/0  */
           int *bitpix,     /* O - number of bits per data value pixel      */
           int *naxis,      /* O - number of axes in the data array         */
           LONGLONG naxes[],    /* O - length of each data axis                 */
           long *pcount,    /* O - number of group parameters (usually 0)   */
           long *gcount,    /* O - number of random groups (usually 1 or 0) */
           int *extend,     /* O - may FITS file haave extensions?          */
           double *bscale,  /* O - array pixel linear scaling factor        */
           double *bzero,   /* O - array pixel linear scaling zero point    */
           LONGLONG *blank, /* O - value used to represent undefined pixels */
           int *nspace,     /* O - number of blank keywords prior to END    */
           int *status)     /* IO - error status                            */
{
/*
  Get the Primary HeaDer parameters.  Check that the keywords conform to
  the FITS standard and return the parameters which determine the size and
  structure of the primary array or IMAGE extension.
*/
    int unknown, found_end, tstatus, ii, nextkey, namelen;
    long longbitpix, longnaxis;
    LONGLONG axislen;
    char message[FLEN_ERRMSG], keyword[FLEN_KEYWORD];
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE];

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    if (simple)
       *simple = 1;

    unknown = 0;

    /*--------------------------------------------------------------------*/
    /*  Get 1st keyword of HDU and test whether it is SIMPLE or XTENSION  */
    /*--------------------------------------------------------------------*/
    ffgkyn(fptr, 1, name, value, comm, status);

    if ((fptr->Fptr)->curhdu == 0) /* Is this the beginning of the FITS file? */
    {
        if (!strcmp(name, "SIMPLE"))
        {
            if (value[0] == 'F')
            {
                if (simple)
                    *simple=0;          /* not a simple FITS file */
            }
            else if (value[0] != 'T')
                return(*status = BAD_SIMPLE);
        }

        else
        {
            snprintf(message, FLEN_ERRMSG,
                   "First keyword of the file is not SIMPLE: %s", name);
            ffpmsg(message);
            return(*status = NO_SIMPLE);
        }
    }

    else    /* not beginning of the file, so presumably an IMAGE extension */
    {       /* or it could be a compressed image in a binary table */

        if (!strcmp(name, "XTENSION"))
        {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                  ( strcmp(xtension, "IMAGE")  &&
                    strcmp(xtension, "IUEIMAGE") ) )
            {
                unknown = 1;  /* unknown type of extension; press on anyway */
                snprintf(message, FLEN_ERRMSG,
                   "This is not an IMAGE extension: %s", value);
                ffpmsg(message);
            }
        }

        else  /* error: 1st keyword of extension != XTENSION */
        {
            snprintf(message, FLEN_ERRMSG,
            "First keyword of the extension is not XTENSION: %s", name);
            ffpmsg(message);
            return(*status = NO_XTENSION);
        }
    }

    if (unknown && (fptr->Fptr)->compressimg)
    {
        /* this is a compressed image, so read ZBITPIX, ZNAXIS keywords */
        unknown = 0;  /* reset flag */
        ffxmsg(3, message); /* clear previous spurious error message */

        if (bitpix)
        {
            ffgidt(fptr, bitpix, status); /* get bitpix value */

            if (*status > 0)
            {
                ffpmsg("Error reading BITPIX value of compressed image");
                return(*status);
            }
        }

        if (naxis)
        {
            ffgidm(fptr, naxis, status); /* get NAXIS value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXIS value of compressed image");
                return(*status);
            }
        }

        if (naxes)
        {
            ffgiszll(fptr, maxdim, naxes, status);  /* get NAXISn value */

            if (*status > 0)
            {
                ffpmsg("Error reading NAXISn values of compressed image");
                return(*status);
            }
        }

        nextkey = 9; /* skip required table keywords in the following search */
    }
    else
    {

        /*----------------------------------------------------------------*/
        /*  Get 2nd keyword;  test whether it is BITPIX with legal value  */
        /*----------------------------------------------------------------*/
        ffgkyn(fptr, 2, name, value, comm, status);  /* BITPIX = 2nd keyword */

        if (strcmp(name, "BITPIX"))
        {
            snprintf(message, FLEN_ERRMSG,
            "Second keyword of the extension is not BITPIX: %s", name);
            ffpmsg(message);
            return(*status = NO_BITPIX);
        }

        if (ffc2ii(value,  &longbitpix, status) > 0)
        {
            snprintf(message, FLEN_ERRMSG,
            "Value of BITPIX keyword is not an integer: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        else if (longbitpix != BYTE_IMG && longbitpix != SHORT_IMG &&
             longbitpix != LONG_IMG && longbitpix != LONGLONG_IMG &&
             longbitpix != FLOAT_IMG && longbitpix != DOUBLE_IMG)
        {
            snprintf(message, FLEN_ERRMSG,
            "Illegal value for BITPIX keyword: %s", value);
            ffpmsg(message);
            return(*status = BAD_BITPIX);
        }
        if (bitpix)
            *bitpix = longbitpix;  /* do explicit type conversion */

        /*---------------------------------------------------------------*/
        /*  Get 3rd keyword;  test whether it is NAXIS with legal value  */
        /*---------------------------------------------------------------*/
        ffgtkn(fptr, 3, "NAXIS",  &longnaxis, status);

        if (*status == BAD_ORDER)
            return(*status = NO_NAXIS);
        else if (*status == NOT_POS_INT || longnaxis > 999)
        {
            snprintf(message,FLEN_ERRMSG,"NAXIS = %ld is illegal", longnaxis);
            ffpmsg(message);
            return(*status = BAD_NAXIS);
        }
        else
            if (naxis)
                 *naxis = longnaxis;  /* do explicit type conversion */

        /*---------------------------------------------------------*/
        /*  Get the next NAXISn keywords and test for legal values */
        /*---------------------------------------------------------*/
        for (ii=0, nextkey=4; ii < longnaxis; ii++, nextkey++)
        {
            ffkeyn("NAXIS", ii+1, keyword, status);
            ffgtknjj(fptr, 4+ii, keyword, &axislen, status);

            if (*status == BAD_ORDER)
                return(*status = NO_NAXES);
            else if (*status == NOT_POS_INT)
                return(*status = BAD_NAXES);
            else if (ii < maxdim)
                if (naxes)
                    naxes[ii] = axislen;
        }
    }

    /*---------------------------------------------------------*/
    /*  now look for other keywords of interest:               */
    /*  BSCALE, BZERO, BLANK, PCOUNT, GCOUNT, EXTEND, and END  */
    /*---------------------------------------------------------*/

    /*  initialize default values in case keyword is not present */
    if (bscale)
        *bscale = 1.0;
    if (bzero)
        *bzero  = 0.0;
    if (pcount)
        *pcount = 0;
    if (gcount)
        *gcount = 1;
    if (extend)
        *extend = 0;
    if (blank)
      *blank = NULL_UNDEFINED; /* no default null value for BITPIX=8,16,32 */

    *nspace = 0;
    found_end = 0;
    tstatus = *status;

    for (; !found_end; nextkey++)  
    {
      /* get next keyword */
      /* don't use ffgkyn here because it trys to parse the card to read */
      /* the value string, thus failing to read the file just because of */
      /* minor syntax errors in optional keywords.                       */

      if (ffgrec(fptr, nextkey, card, status) > 0 )  /* get the 80-byte card */
      {
        if (*status == KEY_OUT_BOUNDS)
        {
          found_end = 1;  /* simply hit the end of the header */
          *status = tstatus;  /* reset error status */
        }
        else          
        {
          ffpmsg("Failed to find the END keyword in header (ffgphd).");
        }
      }
      else /* got the next keyword without error */
      {
        ffgknm(card, name, &namelen, status); /* get the keyword name */

        if (fftrec(name, status) > 0)  /* test keyword name; catches no END */
        {
          snprintf(message, FLEN_ERRMSG,
              "Name of keyword no. %d contains illegal character(s): %s",
              nextkey, name);
          ffpmsg(message);

          if (nextkey % 36 == 0) /* test if at beginning of 36-card record */
            ffpmsg("  (This may indicate a missing END keyword).");
        }

        if (!strcmp(name, "BSCALE") && bscale)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bscale, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bscale = 1.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BSCALE keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BZERO") && bzero)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2dd(value, bzero, status) > 0) /* convert to double */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *bzero = 0.0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BZERO keyword value as a double: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "BLANK") && blank)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2jj(value, blank, status) > 0) /* convert to LONGLONG */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *blank = NULL_UNDEFINED;

                snprintf(message, FLEN_ERRMSG,
                "Error reading BLANK keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "PCOUNT") && pcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, pcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading PCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "GCOUNT") && gcount)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ii(value, gcount, status) > 0) /* convert to long */
            {
                snprintf(message, FLEN_ERRMSG,
                "Error reading GCOUNT keyword value as an integer: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "EXTEND") && extend)
        {
            *nspace = 0;  /* reset count of blank keywords */
            ffpsvc(card, value, comm, status); /* parse value and comment */

            if (ffc2ll(value, extend, status) > 0) /* convert to logical */
            {
                /* reset error status and continue, but still issue warning */
                *status = tstatus;
                *extend = 0;

                snprintf(message, FLEN_ERRMSG,
                "Error reading EXTEND keyword value as a logical: %s", value);
                ffpmsg(message);
            }
        }

        else if (!strcmp(name, "END"))
            found_end = 1;

        else if (!card[0] )
            *nspace = *nspace + 1;  /* this is a blank card in the header */

        else
            *nspace = 0;  /* reset count of blank keywords immediately
                            before the END keyword to zero   */
      }

      if (*status > 0)  /* exit on error after writing error message */
      {
        if ((fptr->Fptr)->curhdu == 0)
            ffpmsg(
            "Failed to read the required primary array header keywords.");
        else
            ffpmsg(
            "Failed to read the required image extension header keywords.");

        return(*status);
      }
    }

    if (unknown)
       *status = NOT_IMAGE;

    return(*status);
}